

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::Set(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *val,SQInteger selfidx)

{
  int iVar1;
  bool bVar2;
  SQChar *pSVar3;
  SQObjectPtr *val_00;
  SQChar *pSVar4;
  SQInteger SVar5;
  SQInstance *in_RCX;
  uint *in_RDX;
  int *in_RSI;
  SQVM *in_RDI;
  SQObjectPtr *in_R8;
  SQObjectPtr *unaff_retaddr;
  SQObjectPtr *in_stack_00000008;
  SQObjectPtr *in_stack_00000010;
  SQVM *in_stack_00000018;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  SQObjectPtr *in_stack_ffffffffffffffb0;
  SQTable *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  bool local_1;
  
  iVar1 = *in_RSI;
  if (iVar1 == 0x8000040) {
    if ((*in_RDX & 0x4000000) == 0) {
      pSVar4 = GetTypeName((SQObjectPtr *)0x143c7d);
      pSVar3 = GetTypeName((SQObjectPtr *)0x143c8c);
      Raise_Error(in_RDI,"indexing %s with %s",pSVar4,pSVar3);
      return false;
    }
    if (*in_RDX == 0x5000004) {
      val_00 = (SQObjectPtr *)(long)(float)in_RDX[2];
    }
    else {
      val_00 = *(SQObjectPtr **)(in_RDX + 2);
    }
    bVar2 = SQArray::Set((SQArray *)in_stack_ffffffffffffffb8,*(SQInteger *)(in_RSI + 2),val_00);
    if (!bVar2) {
      Raise_IdxError(in_RDI,(SQObjectPtr *)in_stack_ffffffffffffffb8);
      return false;
    }
    return true;
  }
  if (iVar1 == 0xa000020) {
    bVar2 = SQTable::Set(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffa8);
    if (bVar2) {
      return true;
    }
  }
  else {
    if (iVar1 != 0xa008000) {
      pSVar4 = GetTypeName((SQObjectPtr *)0x143d31);
      Raise_Error(in_RDI,"trying to set \'%s\'",pSVar4);
      return false;
    }
    bVar2 = SQInstance::Set(in_RCX,in_R8,
                            (SQObjectPtr *)CONCAT44(0xa008000,in_stack_ffffffffffffffc8));
    if (bVar2) {
      return true;
    }
  }
  SVar5 = FallBackSet(in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (SVar5 == 0) {
    local_1 = true;
  }
  else if ((SVar5 == 1) || (SVar5 != 2)) {
    if ((in_R8 == (SQObjectPtr *)0x0) &&
       (bVar2 = SQTable::Set(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffa8), bVar2)) {
      local_1 = true;
    }
    else {
      Raise_IdxError(in_RDI,(SQObjectPtr *)in_stack_ffffffffffffffb8);
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQVM::Set(const SQObjectPtr &self,const SQObjectPtr &key,const SQObjectPtr &val,SQInteger selfidx)
{
    switch(type(self)){
    case OT_TABLE:
        if(_table(self)->Set(key,val)) return true;
        break;
    case OT_INSTANCE:
        if(_instance(self)->Set(key,val)) return true;
        break;
    case OT_ARRAY:
        if(!sq_isnumeric(key)) { Raise_Error(_SC("indexing %s with %s"),GetTypeName(self),GetTypeName(key)); return false; }
        if(!_array(self)->Set(tointeger(key),val)) {
            Raise_IdxError(key);
            return false;
        }
        return true;
    default:
        Raise_Error(_SC("trying to set '%s'"),GetTypeName(self));
        return false;
    }

    switch(FallBackSet(self,key,val)) {
        case FALLBACK_OK: return true; //okie
        case FALLBACK_NO_MATCH: break; //keep falling back
        case FALLBACK_ERROR: return false; // the metamethod failed
    }
    if(selfidx == 0) {
        if(_table(_roottable)->Set(key,val))
            return true;
    }
    Raise_IdxError(key);
    return false;
}